

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes,Int cell_dim)

{
  char cVar1;
  Alloc *pAVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  void *extraout_RDX;
  int iVar11;
  byte bVar12;
  long lVar13;
  char cVar14;
  size_t sVar15;
  uint uVar16;
  Read<signed_char> RVar17;
  Write<signed_char> cand_codes_w;
  Adj local_2c0;
  Write<int> local_290;
  Write<signed_char> local_280;
  Write<signed_char> local_270;
  int local_260;
  Write<int> local_258;
  int local_248;
  Write<signed_char> local_240;
  Write<signed_char> local_230;
  ulong local_220;
  ulong local_218;
  Write<signed_char> local_210;
  Read<signed_char> s2dim;
  Read<signed_char> c2dim;
  LOs cs2s;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  Write<signed_char> local_1a0;
  Write<int> local_190;
  Write<int> local_180;
  Write<int> local_170;
  Write<signed_char> local_160;
  Write<signed_char> local_150;
  int local_140;
  Write<int> local_138;
  int local_128;
  Write<signed_char> local_120;
  Write<signed_char> local_110;
  type f;
  Adj e2c;
  
  Mesh::ask_up(&e2c,mesh,1,cell_dim);
  Write<int>::Write(&e2ec.write_,(Write<int> *)&e2c);
  Write<int>::Write(&ec2c.write_,&e2c.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&ec_codes.write_,&e2c.codes.write_);
  Mesh::ask_down(&local_2c0,mesh,cell_dim,cell_dim - 1U);
  Write<int>::Write(&cs2s.write_,&local_2c0.super_Graph.ab2b.write_);
  Adj::~Adj(&local_2c0);
  iVar8 = cell_dim + 1;
  if (3 < (uint)cell_dim) {
    iVar8 = -1;
  }
  std::__cxx11::string::string((string *)&local_2c0,"class_dim",(allocator *)&local_1a0);
  Mesh::get_array<signed_char>((Mesh *)&c2dim,(Int)mesh,(string *)(ulong)(uint)cell_dim);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::string((string *)&local_2c0,"class_dim",(allocator *)&local_1a0);
  Mesh::get_array<signed_char>((Mesh *)&s2dim,(Int)mesh,(string *)(ulong)(cell_dim - 1U));
  std::__cxx11::string::~string((string *)&local_2c0);
  pAVar2 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar15 = pAVar2->size;
  }
  else {
    sVar15 = (ulong)pAVar2 >> 3;
  }
  std::__cxx11::string::string((string *)&local_2c0,"",(allocator *)&local_1a0);
  uVar16 = (uint)(sVar15 >> 2);
  Write<signed_char>::Write(&cand_codes_w,uVar16,(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Write<signed_char>::Write((Write<signed_char> *)&f,&cand_codes->write_);
  Write<int>::Write(&f.cands2edges.write_,&cands2edges->write_);
  Write<int>::Write(&f.e2ec.write_,&e2ec.write_);
  Write<int>::Write(&f.ec2c.write_,&ec2c.write_);
  Write<signed_char>::Write(&f.ec_codes.write_,&ec_codes.write_);
  Write<signed_char>::Write(&f.c2dim.write_,&c2dim.write_);
  f.cell_dim = cell_dim;
  Write<int>::Write(&f.cs2s.write_,&cs2s.write_);
  f.nccs = iVar8;
  Write<signed_char>::Write(&f.s2dim.write_,&s2dim.write_);
  Write<signed_char>::Write(&f.cand_codes_w,&cand_codes_w);
  Write<signed_char>::Write(&local_1a0,(Write<signed_char> *)&f);
  Write<int>::Write(&local_190,&f.cands2edges.write_);
  Write<int>::Write(&local_180,&f.e2ec.write_);
  Write<int>::Write(&local_170,&f.ec2c.write_);
  Write<signed_char>::Write(&local_160,&f.ec_codes.write_);
  Write<signed_char>::Write(&local_150,&f.c2dim.write_);
  local_140 = f.cell_dim;
  Write<int>::Write(&local_138,&f.cs2s.write_);
  local_128 = f.nccs;
  Write<signed_char>::Write(&local_120,&f.s2dim.write_);
  Write<signed_char>::Write(&local_110,&f.cand_codes_w);
  if (0 < (int)uVar16) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)&local_2c0,&local_1a0);
    Write<int>::Write(&local_2c0.super_Graph.ab2b.write_,&local_190);
    Write<int>::Write((Write<int> *)&local_2c0.codes,&local_180);
    Write<int>::Write(&local_290,&local_170);
    Write<signed_char>::Write(&local_280,&local_160);
    Write<signed_char>::Write(&local_270,&local_150);
    local_260 = local_140;
    Write<int>::Write(&local_258,&local_138);
    local_248 = local_128;
    Write<signed_char>::Write(&local_240,&local_120);
    Write<signed_char>::Write(&local_230,&local_110);
    entering_parallel = 0;
    local_220 = (ulong)(uVar16 & 0x7fffffff);
    uVar5 = 0;
    while (uVar10 = uVar5, uVar10 != local_220) {
      bVar12 = *(byte *)((long)local_2c0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr + uVar10);
      lVar7 = (long)*(int *)((long)local_2c0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                            uVar10 * 4);
      for (lVar13 = (long)*(int *)((long)local_2c0.codes.write_.shared_alloc_.direct_ptr + lVar7 * 4
                                  );
          lVar13 < *(int *)((long)local_2c0.codes.write_.shared_alloc_.direct_ptr + lVar7 * 4 + 4);
          lVar13 = lVar13 + 1) {
        iVar8 = *(int *)((long)local_290.shared_alloc_.direct_ptr + lVar13 * 4);
        cVar14 = (char)*(byte *)((long)local_280.shared_alloc_.direct_ptr + lVar13) >> 3;
        bVar9 = *(byte *)((long)local_280.shared_alloc_.direct_ptr + lVar13) >> 1 & 3;
        cVar1 = *(char *)((long)local_270.shared_alloc_.direct_ptr + (long)iVar8);
        iVar8 = iVar8 * local_248;
        if ((bVar12 & 1) == 0) goto LAB_0024a87b;
        if (local_260 == 1) {
          uVar16 = 2;
          goto switchD_0024a73d_default;
        }
        if (local_260 == 2) {
          if (cVar14 == '\x02') {
            uVar16 = -(uint)(bVar9 != 0) | 1;
            if (bVar9 == 1) {
              uVar16 = 0;
            }
          }
          else {
            if (cVar14 == '\x01') {
              uVar16 = -(uint)(bVar9 != 0);
              goto LAB_0024a814;
            }
            uVar16 = 0xffffffff;
            if ((cVar14 == '\0') && (uVar16 = -(uint)(bVar9 != 0) | 2, bVar9 == 1)) {
              uVar16 = 1;
            }
          }
          goto switchD_0024a73d_default;
        }
        uVar16 = 0xffffffff;
        if (local_260 != 3) goto switchD_0024a73d_default;
        uVar16 = 0xffffffff;
        switch(cVar14) {
        case '\0':
          uVar16 = -(uint)(bVar9 != 0) | 3;
          break;
        case '\x01':
          uVar16 = -(uint)(bVar9 != 0) | 1;
          goto LAB_0024a82b;
        case '\x02':
          uVar16 = -(uint)(bVar9 != 0) | 2;
          goto LAB_0024a84a;
        case '\x03':
          uVar16 = -(uint)(bVar9 != 0);
          break;
        case '\x04':
          uVar16 = -(uint)(bVar9 != 0);
LAB_0024a82b:
          uVar3 = 3;
          goto LAB_0024a830;
        case '\x05':
          uVar16 = -(uint)(bVar9 != 0);
LAB_0024a84a:
          if (bVar9 == 1) {
            uVar16 = 1;
          }
        default:
          goto switchD_0024a73d_default;
        }
LAB_0024a814:
        uVar3 = 2;
LAB_0024a830:
        if (bVar9 == 1) {
          uVar16 = uVar3;
        }
switchD_0024a73d_default:
        if (*(char *)((long)local_240.shared_alloc_.direct_ptr +
                     (long)*(int *)((long)local_258.shared_alloc_.direct_ptr +
                                   (long)(int)(uVar16 + iVar8) * 4)) != cVar1) {
          bVar12 = bVar12 & 0xfe;
        }
LAB_0024a87b:
        bVar6 = bVar12;
        if ((bVar12 & 2) == 0) goto LAB_0024a982;
        iVar11 = -1;
        if (local_260 != 3) {
          if (local_260 == 2) {
            if (cVar14 == '\0') goto switchD_0024a8f5_caseD_2;
            if (cVar14 == '\x01') goto switchD_0024a8f5_caseD_3;
            if (cVar14 == '\x02') {
              iVar11 = (uint)(bVar9 == 1) * 2 + -1;
              if (bVar9 == 0) {
                iVar11 = 0;
              }
            }
          }
          else if (local_260 == 1) {
            iVar11 = 2;
          }
          goto switchD_0024a8f5_default;
        }
        switch(cVar14) {
        case '\0':
          iVar11 = (uint)(bVar9 == 1) * 4 + -1;
          break;
        case '\x01':
          iVar11 = (uint)(bVar9 == 1) * 2 + -1;
          goto LAB_0024a94c;
        case '\x02':
switchD_0024a8f5_caseD_2:
          iVar11 = (uint)(bVar9 == 1) * 3 + -1;
          goto LAB_0024a95c;
        case '\x03':
switchD_0024a8f5_caseD_3:
          iVar11 = -(uint)(bVar9 != 1);
          break;
        case '\x04':
          iVar11 = -(uint)(bVar9 != 1);
LAB_0024a94c:
          iVar4 = 3;
          goto LAB_0024a960;
        case '\x05':
          iVar11 = -(uint)(bVar9 != 1);
LAB_0024a95c:
          iVar4 = 1;
          goto LAB_0024a960;
        default:
          goto switchD_0024a8f5_default;
        }
        iVar4 = 2;
LAB_0024a960:
        if (bVar9 == 0) {
          iVar11 = iVar4;
        }
switchD_0024a8f5_default:
        bVar6 = bVar12 & 0xfd;
        if (*(char *)((long)local_240.shared_alloc_.direct_ptr +
                     (long)*(int *)((long)local_258.shared_alloc_.direct_ptr +
                                   (long)(iVar11 + iVar8) * 4)) == cVar1) {
          bVar6 = bVar12;
        }
LAB_0024a982:
        bVar12 = bVar6;
      }
      *(byte *)((long)local_230.shared_alloc_.direct_ptr + uVar10) = bVar12;
      local_218 = uVar10;
      uVar5 = uVar10 + 1;
    }
    check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
    ~__0((__0 *)&local_2c0);
  }
  check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
  ~__0((__0 *)&local_1a0);
  Write<signed_char>::Write(&local_210,&cand_codes_w);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_210);
  Write<signed_char>::~Write(&local_210);
  check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
  ~__0((__0 *)&f);
  Write<signed_char>::~Write(&cand_codes_w);
  Write<signed_char>::~Write(&s2dim.write_);
  Write<signed_char>::~Write(&c2dim.write_);
  Write<int>::~Write(&cs2s.write_);
  Write<signed_char>::~Write(&ec_codes.write_);
  Write<int>::~Write(&ec2c.write_);
  Write<int>::~Write(&e2ec.write_);
  Adj::~Adj(&e2c);
  RVar17.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar17.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar17.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes, Int cell_dim) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto c2dim = mesh->get_array<I8>(cell_dim, "class_dim");
  auto s2dim = mesh->get_array<I8>(cell_dim - 1, "class_dim");
  auto ncands = cands2edges.size();
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto e = cands2edges[cand];
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto c_dim = c2dim[c];
      for (Int eev_col = 0; eev_col < 2; ++eev_col) {
        if (!collapses(code, eev_col)) continue;
        auto eev_onto = 1 - eev_col;
        auto cev_onto = rot ^ eev_onto;
        auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
        auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
        auto s_opp = cs2s[c * nccs + ccs_opp];
        if (s2dim[s_opp] != c_dim) {
          code = dont_collapse(code, eev_col);
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_exposure");
  return cand_codes_w;
}